

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.hpp
# Opt level: O0

Index * __thiscall verilogAST::Index::clone_impl(Index *this)

{
  Index *this_00;
  pointer __fn;
  int in_ECX;
  void *__child_stack;
  void *in_R8;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_38 [3];
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
  local_20;
  Index *local_10;
  Index *this_local;
  
  local_10 = this;
  this_00 = (Index *)operator_new(0x20);
  clone_index_value(&local_20,this);
  __fn = std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
         operator->(&this->index);
  Expression::clone((Expression *)local_38,(__fn *)__fn,__child_stack,in_ECX,in_R8);
  Index(this_00,&local_20,local_38);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_38);
  std::
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
  ::~variant(&local_20);
  return this_00;
}

Assistant:

virtual Index* clone_impl() const override {
    return new Index(this->clone_index_value(), this->index->clone());
  }